

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_clipper.cpp
# Opt level: O3

void __thiscall Clipper::RemoveClipRange(Clipper *this,angle_t start,angle_t end)

{
  uint uVar1;
  ClipNode *pCVar2;
  
  pCVar2 = this->silhouette;
  if (pCVar2 != (ClipNode *)0x0) {
    do {
      uVar1 = pCVar2->end;
      if (start < uVar1) {
        if (start < pCVar2->start) goto LAB_004629cc;
        if (end <= uVar1) {
          return;
        }
        goto LAB_004629c3;
      }
      pCVar2 = pCVar2->next;
    } while (pCVar2 != (ClipNode *)0x0);
LAB_004629a6:
    if (end <= start) {
      return;
    }
  }
  DoRemoveClipRange(this,start,end);
  return;
LAB_004629c3:
  pCVar2 = pCVar2->next;
  start = uVar1;
  if (pCVar2 == (ClipNode *)0x0) goto LAB_004629a6;
LAB_004629cc:
  if (end <= pCVar2->start) goto LAB_004629a6;
  DoRemoveClipRange(this,start,pCVar2->start);
  uVar1 = pCVar2->end;
  goto LAB_004629c3;
}

Assistant:

void Clipper::RemoveClipRange(angle_t start, angle_t end)
{
	ClipNode *node;

	if (silhouette)
	{
		node = silhouette;
		while (node != NULL && node->end <= start)
		{
			node = node->next;
		}
		if (node != NULL && node->start <= start)
		{
			if (node->end >= end) return;
			start = node->end;
			node = node->next;
		}
		while (node != NULL && node->start < end)
		{
			DoRemoveClipRange(start, node->start);
			start = node->end;
			node = node->next;
		}
		if (start >= end) return;
	}
	DoRemoveClipRange(start, end);
}